

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibBox.c
# Opt level: O2

void If_LibBoxPrint(FILE *pFile,If_LibBox_t *p)

{
  char *pcVar1;
  undefined8 *puVar2;
  int i;
  int iVar3;
  int iVar4;
  
  pcVar1 = Extra_TimeStamp();
  fprintf((FILE *)pFile,"# Box library written by ABC on %s.\n",pcVar1);
  fwrite("# <Name> <ID> <Type> <I> <O>\n",0x1d,1,(FILE *)pFile);
  for (i = 0; i < p->vBoxes->nSize; i = i + 1) {
    puVar2 = (undefined8 *)Vec_PtrEntry(p->vBoxes,i);
    if (puVar2 != (undefined8 *)0x0) {
      fprintf((FILE *)pFile,"%s %d %d %d %d\n",*puVar2,(ulong)*(uint *)((long)puVar2 + 0xc),
              (ulong)(*(char *)((long)puVar2 + 9) == '\0'),(ulong)*(uint *)(puVar2 + 2),
              *(undefined4 *)((long)puVar2 + 0x14));
      for (iVar4 = 0; iVar4 < *(int *)((long)puVar2 + 0x14); iVar4 = iVar4 + 1) {
        iVar3 = 0;
        while( true ) {
          if (*(int *)(puVar2 + 2) <= iVar3) break;
          if (*(int *)(puVar2[3] + (long)(*(int *)(puVar2 + 2) * iVar4 + iVar3) * 4) == -1000000000)
          {
            fwrite("    - ",6,1,(FILE *)pFile);
          }
          else {
            fprintf((FILE *)pFile,"%5d ");
          }
          iVar3 = iVar3 + 1;
        }
        putchar(10);
      }
    }
  }
  return;
}

Assistant:

void If_LibBoxPrint( FILE * pFile, If_LibBox_t * p )
{
    If_Box_t * pBox;
    int i, j, k;
    fprintf( pFile, "# Box library written by ABC on %s.\n", Extra_TimeStamp() );
    fprintf( pFile, "# <Name> <ID> <Type> <I> <O>\n" );
    If_LibBoxForEachBox( p, pBox, i )
    {
        fprintf( pFile, "%s %d %d %d %d\n", pBox->pName, pBox->Id, !pBox->fBlack, pBox->nPis, pBox->nPos );
        for ( j = 0; j < pBox->nPos; j++, printf("\n") )
            for ( k = 0; k < pBox->nPis; k++ )
                if ( pBox->pDelays[j * pBox->nPis + k] == -ABC_INFINITY )
                    fprintf( pFile, "    - " );
                else
                    fprintf( pFile, "%5d ", pBox->pDelays[j * pBox->nPis + k] );
    }
}